

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O1

void __thiscall Handler::InputRequest(Handler *this,uint16_t *startDay,uint16_t *endDay)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *__nptr;
  ushort uVar4;
  int *piVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  undefined8 uVar9;
  ushort uVar10;
  uint uVar11;
  long lVar12;
  string idStr;
  string modelStr;
  int id;
  string operationStr;
  string RStr;
  vector<Request,_std::allocator<Request>_> request;
  ushort local_122;
  undefined1 *local_108;
  long local_100;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  key_type local_c8;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  ushort *local_88;
  ulong local_80;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_78;
  ulong local_70;
  char *local_68;
  undefined8 local_60;
  char local_58 [16];
  vector<Request,_std::allocator<Request>_> local_48;
  
  local_68 = local_58;
  local_60 = 0;
  local_58[0] = '\0';
  uVar10 = *startDay;
  local_88 = endDay;
  if (uVar10 < *endDay) {
    local_78 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&this->virtualMachineMap;
    do {
      local_a8 = local_98;
      local_a0 = 0;
      local_98[0] = 0;
      local_e8 = local_d8;
      local_e0 = 0;
      local_d8[0] = 0;
      local_108 = local_f8;
      local_100 = 0;
      local_f8[0] = 0;
      std::operator>>((istream *)&std::cin,(string *)&local_68);
      __nptr = local_68;
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      *piVar5 = 0;
      uVar6 = strtol(__nptr,(char **)&local_c8,10);
      if ((char *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,(int)local_c8._M_dataplus._M_p) == __nptr
         ) {
        std::__throw_invalid_argument("stoi");
LAB_00108c48:
        uVar9 = std::__throw_out_of_range("stoi");
        if (local_48.super__Vector_base<Request,_std::allocator<Request>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<Request,_std::allocator<Request>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_108 != local_f8) {
          operator_delete(local_108);
        }
        if (local_e8 != local_d8) {
          operator_delete(local_e8);
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8);
        }
        if (local_68 != local_58) {
          operator_delete(local_68);
        }
        _Unwind_Resume(uVar9);
      }
      if (((long)(int)uVar6 != uVar6) || (*piVar5 == 0x22)) goto LAB_00108c48;
      if (*piVar5 == 0) {
        *piVar5 = iVar2;
      }
      local_80 = (ulong)uVar10;
      std::vector<RequestResult,_std::allocator<RequestResult>_>::resize
                (&(this->result).super__Vector_base<Result,_std::allocator<Result>_>._M_impl.
                  super__Vector_impl_data._M_start[local_80].requestResult,uVar6 & 0xffff);
      std::vector<Request,_std::allocator<Request>_>::vector
                (&local_48,uVar6 & 0xffff,(allocator_type *)&local_c8);
      if ((short)uVar6 == 0) {
        uVar3 = 0;
      }
      else {
        local_70 = uVar6 & 0xffff;
        uVar6 = 0;
        uVar3 = 0;
        do {
          std::operator>>((istream *)&std::cin,(string *)&local_a8);
          cVar1 = local_a8[1];
          if (cVar1 == 'a') {
            std::operator>>((istream *)&std::cin,(string *)&local_e8);
            std::__cxx11::string::substr((ulong)&local_c8,(ulong)&local_e8);
            pmVar7 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](local_78,&local_c8);
            local_122 = *pmVar7;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,(int)local_c8._M_dataplus._M_p) !=
                &local_c8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_c8._M_dataplus._M_p._4_4_,
                                       (int)local_c8._M_dataplus._M_p));
            }
          }
          std::operator>>((istream *)&std::cin,(string *)&local_108);
          local_c8._M_dataplus._M_p._0_4_ = 0;
          if (local_100 != 1) {
            local_c8._M_dataplus._M_p._0_4_ = 0;
            lVar12 = 0;
            do {
              local_c8._M_dataplus._M_p._0_4_ =
                   (int)(char)local_108[lVar12] + (int)local_c8._M_dataplus._M_p * 10 + -0x30;
              lVar12 = lVar12 + 1;
            } while (local_100 + -1 != lVar12);
          }
          iVar2 = (int)local_c8._M_dataplus._M_p;
          if (cVar1 == 'a') {
            pmVar8 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&this->idVirtualMachineMap,(key_type *)&local_c8);
            *pmVar8 = (uint)local_122;
            uVar4 = local_122;
            uVar11 = uVar3;
            uVar3 = uVar3 + 1;
          }
          else {
            pmVar8 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&this->idVirtualMachineMap,(key_type *)&local_c8);
            uVar4 = (ushort)*pmVar8;
            uVar11 = 0;
          }
          local_48.super__Vector_base<Request,_std::allocator<Request>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6].add = cVar1 == 'a';
          local_48.super__Vector_base<Request,_std::allocator<Request>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6].addIdx = uVar11;
          local_48.super__Vector_base<Request,_std::allocator<Request>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6].vmIdx = uVar4;
          local_48.super__Vector_base<Request,_std::allocator<Request>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6].vmId = iVar2;
          uVar6 = uVar6 + 1;
        } while (uVar6 != local_70);
      }
      uVar6 = local_80;
      std::vector<Request,_std::allocator<Request>_>::operator=
                ((vector<Request,_std::allocator<Request>_> *)
                 ((long)&(((this->requests).
                           super__Vector_base<std::vector<Request,_std::allocator<Request>_>,_std::allocator<std::vector<Request,_std::allocator<Request>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<Request,_std::allocator<Request>_>)._M_impl.
                         super__Vector_impl_data + (ulong)(uint)((int)local_80 * 0x18)),&local_48);
      (this->addRequestCounts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar6] = uVar3;
      if (local_48.super__Vector_base<Request,_std::allocator<Request>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<Request,_std::allocator<Request>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_108 != local_f8) {
        operator_delete(local_108);
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < *local_88);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

void Handler::InputRequest(const uint16_t &startDay, const uint16_t &endDay) {
    string RStr;
    uint16_t vmIdx;

    for (uint16_t i = startDay; i < endDay; ++i) {
        uint32_t R;
        string operationStr, modelStr, idStr;
        std::cin >> RStr;
        R = (uint16_t) std::stoi(RStr);
        result[i].requestResult.resize(R);
        std::vector<Request> request(R);
        uint32_t addRequestCount = 0u;

        for (uint32_t j = 0u; j < R; ++j) {
            Request req;

            std::cin >> operationStr;
            req.add = (operationStr[1] == 'a');
            if (req.add) {
                std::cin >> modelStr;
                vmIdx = virtualMachineMap[modelStr.substr(0, modelStr.size() - 1)];
            }

            std::cin >> idStr;
            int id = 0;
            for (int k = 0; k < idStr.size() - 1; ++k) {
                id = id * 10 + (idStr[k] - 48);
            }
            req.vmId = id;

            if (req.add) {
                req.addIdx = addRequestCount++;
                req.vmIdx = vmIdx;
                idVirtualMachineMap[id] = vmIdx;
            } else {
                req.vmIdx = idVirtualMachineMap[id];
            }

            request[j] = req;
        }

        requests[i] = request;
        addRequestCounts[i] = addRequestCount;
    }
}